

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_poll.c
# Opt level: O0

int check_version_3_17_plus(void)

{
  int iVar1;
  char *ver;
  utsname un;
  int minor;
  
  uname((utsname *)((long)&ver + 2));
  if (((un.nodename[0x39] < '3') || ('9' < un.nodename[0x39])) || (un.nodename[0x3a] != '.')) {
    un.__domainname[0x3d] = -1;
    un.__domainname[0x3e] = -1;
    un.__domainname[0x3f] = -1;
    un.__domainname[0x40] = -1;
  }
  else if (un.nodename[0x39] + -0x30 < 4) {
    if ((un.nodename[0x3b] < '0') || ('9' < un.nodename[0x3b])) {
      un.__domainname[0x3d] = -1;
      un.__domainname[0x3e] = -1;
      un.__domainname[0x3f] = -1;
      un.__domainname[0x40] = -1;
    }
    else {
      un.__domainname._57_4_ = un.nodename[0x3b] + -0x30;
      if ((un.nodename[0x3c] < '0') || ('9' < un.nodename[0x3c])) {
        if (un.nodename[0x3c] != '.') {
          return -1;
        }
      }
      else {
        un.__domainname._57_4_ = un.__domainname._57_4_ * 10 + (int)un.nodename[0x3c] + -0x30;
      }
      if ((int)un.__domainname._57_4_ < 0x11) {
        un.__domainname[0x3d] = -1;
        un.__domainname[0x3e] = -1;
        un.__domainname[0x3f] = -1;
        un.__domainname[0x40] = -1;
      }
      else {
        un.__domainname[0x3d] = '\0';
        un.__domainname[0x3e] = '\0';
        un.__domainname[0x3f] = '\0';
        un.__domainname[0x40] = '\0';
      }
    }
  }
  else {
    un.__domainname[0x3d] = '\0';
    un.__domainname[0x3e] = '\0';
    un.__domainname[0x3f] = '\0';
    un.__domainname[0x40] = '\0';
  }
  iVar1._0_1_ = un.__domainname[0x3d];
  iVar1._1_1_ = un.__domainname[0x3e];
  iVar1._2_1_ = un.__domainname[0x3f];
  iVar1._3_1_ = un.__domainname[0x40];
  return iVar1;
}

Assistant:

static int check_version_3_17_plus( void )
{
    int minor;
    struct utsname un;
    const char *ver;

    /* Get version information */
    uname(&un);
    ver = un.release;

    /* Check major version; assume a single digit */
    if( ver[0] < '3' || ver[0] > '9' || ver [1] != '.' )
        return( -1 );

    if( ver[0] - '0' > 3 )
        return( 0 );

    /* Ok, so now we know major == 3, check minor.
     * Assume 1 or 2 digits. */
    if( ver[2] < '0' || ver[2] > '9' )
        return( -1 );

    minor = ver[2] - '0';

    if( ver[3] >= '0' && ver[3] <= '9' )
        minor = 10 * minor + ver[3] - '0';
    else if( ver [3] != '.' )
        return( -1 );

    if( minor < 17 )
        return( -1 );

    return( 0 );
}